

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

void __thiscall Assimp::D3DS::Material::Material(Material *this,Material *other)

{
  this->_vptr_Material = (_func_int **)&PTR__Material_0075ae68;
  std::__cxx11::string::string((string *)&this->mName,(string *)&other->mName);
  (this->mDiffuse).r = (other->mDiffuse).r;
  (this->mDiffuse).g = (other->mDiffuse).g;
  (this->mDiffuse).b = (other->mDiffuse).b;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = other->mShininessStrength;
  (this->mSpecular).r = (other->mSpecular).r;
  (this->mSpecular).g = (other->mSpecular).g;
  (this->mSpecular).b = (other->mSpecular).b;
  (this->mAmbient).r = (other->mAmbient).r;
  (this->mAmbient).g = (other->mAmbient).g;
  (this->mAmbient).b = (other->mAmbient).b;
  this->mShading = other->mShading;
  this->mTransparency = other->mTransparency;
  Texture::Texture(&this->sTexDiffuse,&other->sTexDiffuse);
  Texture::Texture(&this->sTexOpacity,&other->sTexOpacity);
  Texture::Texture(&this->sTexSpecular,&other->sTexSpecular);
  Texture::Texture(&this->sTexReflective,&other->sTexReflective);
  Texture::Texture(&this->sTexBump,&other->sTexBump);
  Texture::Texture(&this->sTexEmissive,&other->sTexEmissive);
  Texture::Texture(&this->sTexShininess,&other->sTexShininess);
  this->mBumpHeight = other->mBumpHeight;
  (this->mEmissive).r = (other->mEmissive).r;
  (this->mEmissive).g = (other->mEmissive).g;
  (this->mEmissive).b = (other->mEmissive).b;
  Texture::Texture(&this->sTexAmbient,&other->sTexAmbient);
  this->mTwoSided = other->mTwoSided;
  return;
}

Assistant:

Material(Material &&other) AI_NO_EXCEPT
    : mName(std::move(other.mName))
    , mDiffuse(std::move(other.mDiffuse))
    , mSpecularExponent(std::move(other.mSpecularExponent))
    , mShininessStrength(std::move(other.mShininessStrength))
    , mSpecular(std::move(other.mSpecular))
    , mAmbient(std::move(other.mAmbient))
    , mShading(std::move(other.mShading))
    , mTransparency(std::move(other.mTransparency))
    , sTexDiffuse(std::move(other.sTexDiffuse))
    , sTexOpacity(std::move(other.sTexOpacity))
    , sTexSpecular(std::move(other.sTexSpecular))
    , sTexReflective(std::move(other.sTexReflective))
    , sTexBump(std::move(other.sTexBump))
    , sTexEmissive(std::move(other.sTexEmissive))
    , sTexShininess(std::move(other.sTexShininess))
    , mBumpHeight(std::move(other.mBumpHeight))
    , mEmissive(std::move(other.mEmissive))
    , sTexAmbient(std::move(other.sTexAmbient))
    , mTwoSided(std::move(other.mTwoSided))
    {
    }